

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip6.cpp
# Opt level: O3

void __thiscall clickhouse::ColumnIPv6::ColumnIPv6(ColumnIPv6 *this,ColumnRef *data)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  Type::CreateIPv6();
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016c598;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_28;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
      if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001401db;
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
LAB_001401db:
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnIPv6_0016d2a0;
  std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Column,void>
            ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
             &((data->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_enable_shared_from_this<clickhouse::Column>);
  if (local_38 != 0) {
    peVar2 = (element_type *)
             __dynamic_cast(local_38,&Column::typeinfo,&ColumnFixedString::typeinfo,0);
    if (peVar2 != (element_type *)0x0) {
      (this->data_).super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (this->data_).super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_30;
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_30->_M_use_count = local_30->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_30->_M_use_count = local_30->_M_use_count + 1;
        }
      }
      goto LAB_00140249;
    }
  }
  (this->data_).super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->data_).super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00140249:
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  iVar1 = (*(((this->data_).
              super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_Column)._vptr_Column[6])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"number of entries must be even (two 64-bit numbers for each IPv6)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ColumnIPv6::ColumnIPv6(ColumnRef data)
    : Column(Type::CreateIPv6())
    , data_(data->As<ColumnFixedString>())
{
    if (data_->Size() != 0) {
        throw std::runtime_error("number of entries must be even (two 64-bit numbers for each IPv6)");
    }
}